

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

Curl_ssl_scache_peer * cf_ssl_get_free_peer(Curl_ssl_scache *scache)

{
  size_t sVar1;
  ulong local_20;
  size_t i;
  Curl_ssl_scache_peer *peer;
  Curl_ssl_scache *scache_local;
  
  i = 0;
  local_20 = 0;
  do {
    if (scache->peer_count <= local_20) {
LAB_001c07f3:
      if (i != 0) {
        cf_ssl_scache_clear_peer((Curl_ssl_scache_peer *)i);
      }
      return (Curl_ssl_scache_peer *)i;
    }
    if ((scache->peers[local_20].ssl_peer_key == (char *)0x0) &&
       ((scache->peers[local_20].field_0xa0 & 1) == 0)) {
      i = (size_t)(scache->peers + local_20);
      goto LAB_001c07f3;
    }
    if (scache->peers[local_20].sobj == (void *)0x0) {
      sVar1 = Curl_llist_count(&scache->peers[local_20].sessions);
      if (sVar1 == 0) {
        i = (size_t)(scache->peers + local_20);
        goto LAB_001c07f3;
      }
    }
    if ((i == 0) || (scache->peers[local_20].age < *(long *)(i + 0x98))) {
      i = (size_t)(scache->peers + local_20);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static struct Curl_ssl_scache_peer *
cf_ssl_get_free_peer(struct Curl_ssl_scache *scache)
{
  struct Curl_ssl_scache_peer *peer = NULL;
  size_t i;

  /* find empty or oldest peer */
  for(i = 0; i < scache->peer_count; ++i) {
    /* free peer entry? */
    if(!scache->peers[i].ssl_peer_key && !scache->peers[i].hmac_set) {
      peer = &scache->peers[i];
      break;
    }
    /* peer without sessions and obj */
    if(!scache->peers[i].sobj &&
       !Curl_llist_count(&scache->peers[i].sessions)) {
      peer = &scache->peers[i];
      break;
    }
    /* remember "oldest" peer */
    if(!peer || (scache->peers[i].age < peer->age)) {
      peer = &scache->peers[i];
    }
  }
  DEBUGASSERT(peer);
  if(peer)
    cf_ssl_scache_clear_peer(peer);
  return peer;
}